

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var __thiscall Js::InterpreterStackFrame::ProcessAsmJsModule(InterpreterStackFrame *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ScriptFunction *func_00;
  code *pcVar5;
  uint uVar6;
  WriteBarrierPtr<void> *pWVar7;
  AsmJsModuleMemory *info_00;
  bool bVar8;
  DisableImplicitFlags prevDisableImplicitFlags_00;
  ImplicitCallFlags savedImplicitCallFlags;
  int iVar9;
  int iVar10;
  int iVar11;
  TypeId typeId;
  int iVar12;
  RegSlot RVar13;
  Recycler *pRVar14;
  WriteBarrierPtr *this_00;
  undefined4 *puVar15;
  ThreadContext *this_01;
  void **ppvVar16;
  RecyclableObject *this_02;
  PropertyRecord *pPVar17;
  char16 *pcVar18;
  Var pvVar19;
  FrameDisplay *this_03;
  DynamicType *pDVar20;
  JavascriptMethod p_Var21;
  FunctionBody *pFVar22;
  AsmJsFunctionInfo *this_04;
  uint **ppuVar23;
  undefined8 uVar24;
  ScriptContext *pSVar25;
  PropertyIdArray *propIds;
  Type *literalType;
  InterpreterStackFrame *pIVar26;
  WriteBarrierPtr *this_05;
  double dVar27;
  ModuleExport MVar28;
  void *local_258;
  Var local_250;
  void *local_248;
  Var exportFunc;
  Var func;
  ModuleExport ex;
  int i_6;
  Var newObj;
  ScriptFunction *functionObj;
  int i_5;
  Var functionPtr;
  RegSlot index;
  uint j;
  TrackAllocData local_1c0;
  WriteBarrierPtr<void> *local_198;
  Type *funcTableArray;
  ModuleFunctionTable *modFuncTable;
  EntryPointInfo *pEStack_180;
  int i_4;
  FunctionEntryPointInfo *entrypointInfo;
  AsmJsScriptFunction *scriptFuncObj;
  FunctionInfoPtrPtr functionInfo;
  ModuleFunction *modFunc;
  code *pcStack_158;
  int i_3;
  undefined8 local_150;
  TrackAllocData local_148;
  FrameDisplay *local_120;
  FrameDisplay *pDisplay;
  Var importFunc;
  ModuleFunctionImport *import_1;
  void *pvStack_100;
  int i_2;
  double val_2;
  float val_1;
  int val;
  Var value;
  ModuleVarImport *pMStack_e0;
  AsmJsVarType type_1;
  ModuleVarImport *import;
  int i_1;
  AsmJsVarType type;
  ModuleVar *var;
  int i;
  bool checkParamResult;
  ImplicitCallFlags saveImplicitcallFlags;
  DisableImplicitFlags prevDisableImplicitFlags;
  Var foreign;
  ThreadContext *threadContext;
  Type *localFunctionTables;
  Type *localModuleFunctions;
  Type *localFunctionImports;
  double *localDoubleSlots;
  float *localFloatSlots;
  int *localIntSlots;
  Type *stdLibPtr;
  Type *arrayBufferPtr;
  TrackAllocData local_60;
  WriteBarrierPtr<void> *local_38;
  Type *moduleMemoryPtr;
  AsmJsModuleMemory *moduleMemory;
  AsmJsModuleInfo *info;
  FunctionBody *asmJsModuleFunctionBody;
  InterpreterStackFrame *this_local;
  
  asmJsModuleFunctionBody = (FunctionBody *)this;
  info = (AsmJsModuleInfo *)GetFunctionBody(this);
  moduleMemory = (AsmJsModuleMemory *)FunctionBody::GetAsmJsModuleInfo((FunctionBody *)info);
  if ((DAT_01ea9efa & 1) == 0) {
    iVar12 = *(int *)(this + 0x18);
    iVar9 = AsmJsModuleInfo::GetArgInCount((AsmJsModuleInfo *)moduleMemory);
    if (iVar12 == iVar9 + 1) {
      moduleMemoryPtr = (Type *)AsmJsModuleInfo::GetModuleMemory((AsmJsModuleInfo *)moduleMemory);
      pRVar14 = ScriptContext::GetRecycler(*(ScriptContext **)(this + 0x78));
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&Memory::WriteBarrierPtr<void>::typeinfo,0,
                 (long)*(int *)&moduleMemoryPtr[4].ptr,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                 ,0xa68);
      pRVar14 = Memory::Recycler::TrackAllocInfo(pRVar14,&local_60);
      local_38 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                           ((Memory *)pRVar14,(Recycler *)Memory::Recycler::Alloc,0,
                            (long)*(int *)&moduleMemoryPtr[4].ptr);
      this_00 = (WriteBarrierPtr *)(local_38 + *(int *)&moduleMemoryPtr->ptr);
      if (*(int *)&moduleMemoryPtr->ptr != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar15 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xa6a,
                                    "(moduleMemory.mArrayBufferOffset == AsmJsModuleMemory::MemoryTableBeginOffset)"
                                    ,
                                    "moduleMemory.mArrayBufferOffset == AsmJsModuleMemory::MemoryTableBeginOffset"
                                   );
        if (!bVar8) {
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar15 = 0;
      }
      pWVar7 = local_38;
      this_05 = (WriteBarrierPtr *)(local_38 + *(int *)((long)&moduleMemoryPtr->ptr + 4));
      iVar12 = *(int *)&moduleMemoryPtr[3].ptr;
      iVar9 = *(int *)((long)&moduleMemoryPtr[3].ptr + 4);
      iVar1 = *(int *)&moduleMemoryPtr[1].ptr;
      iVar2 = *(int *)&moduleMemoryPtr[2].ptr;
      iVar3 = *(int *)((long)&moduleMemoryPtr[1].ptr + 4);
      iVar4 = *(int *)((long)&moduleMemoryPtr[2].ptr + 4);
      this_01 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
      if (*(int *)(this + 0x18) < 2) {
        local_248 = (void *)0x0;
      }
      else {
        local_248 = *(void **)(*(long *)(this + 0x20) + 8);
      }
      Memory::WriteBarrierPtr<void>::operator=((WriteBarrierPtr<void> *)this_05,local_248);
      if (*(int *)(this + 0x18) < 3) {
        local_250 = (Var)0x0;
      }
      else {
        local_250 = *(Var *)(*(long *)(this + 0x20) + 0x10);
      }
      if (*(int *)(this + 0x18) < 4) {
        local_258 = (void *)0x0;
      }
      else {
        local_258 = *(void **)(*(long *)(this + 0x20) + 0x18);
      }
      Memory::WriteBarrierPtr<void>::operator=((WriteBarrierPtr<void> *)this_00,local_258);
      prevDisableImplicitFlags_00 = ThreadContext::GetDisableImplicitFlags(this_01);
      savedImplicitCallFlags = ThreadContext::GetImplicitCallFlags(this_01);
      ThreadContext::DisableImplicitCall(this_01);
      ThreadContext::SetImplicitCallFlags(this_01,ImplicitCall_None);
      info_00 = moduleMemory;
      pSVar25 = *(ScriptContext **)(this + 0x78);
      ppvVar16 = Memory::WriteBarrierPtr::operator_cast_to_void__(this_05);
      pvVar19 = *ppvVar16;
      ppvVar16 = Memory::WriteBarrierPtr::operator_cast_to_void__(this_00);
      bVar8 = ASMLink::CheckParams(pSVar25,(AsmJsModuleInfo *)info_00,pvVar19,local_250,*ppvVar16);
      if (bVar8) {
        bVar8 = CheckAndResetImplicitCall(this,prevDisableImplicitFlags_00,savedImplicitCallFlags);
        if (bVar8) {
          AsmJSCompiler::OutputError
                    (*(ScriptContext **)(this + 0x78),
                     L"Asm.js Runtime Error : Params have side effects");
          this_local = (InterpreterStackFrame *)ProcessLinkFailedAsmJsModule(this);
        }
        else {
          for (var._0_4_ = 0; iVar10 = AsmJsModuleInfo::GetVarCount((AsmJsModuleInfo *)moduleMemory)
              , (int)var < iVar10; var._0_4_ = (int)var + 1) {
            _i_1 = AsmJsModuleInfo::GetVar((AsmJsModuleInfo *)moduleMemory,(int)var);
            AsmJsVarType::AsmJsVarType((AsmJsVarType *)((long)&import + 7),_i_1->type);
            bVar8 = AsmJsVarType::isInt((AsmJsVarType *)((long)&import + 7));
            if (bVar8) {
              *(Type *)((long)&pWVar7[iVar12].ptr + (ulong)_i_1->location * 4) =
                   (_i_1->initialiser).intInit;
            }
            else {
              bVar8 = AsmJsVarType::isFloat((AsmJsVarType *)((long)&import + 7));
              if (bVar8) {
                *(Type *)((long)&pWVar7[iVar9].ptr + (ulong)_i_1->location * 4) =
                     (_i_1->initialiser).intInit;
              }
              else {
                bVar8 = AsmJsVarType::isDouble((AsmJsVarType *)((long)&import + 7));
                if (bVar8) {
                  *(Type *)(pWVar7 + (long)iVar1 + (ulong)_i_1->location) = _i_1->initialiser;
                }
                else {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar15 = 1;
                  bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                              ,0xa9c,"((0))","UNREACHED");
                  if (!bVar8) {
                    pcVar5 = (code *)invalidInstructionException();
                    (*pcVar5)();
                  }
                  puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar15 = 0;
                }
              }
            }
          }
          for (import._0_4_ = 0; iVar10 = (int)import,
              iVar11 = AsmJsModuleInfo::GetVarImportCount((AsmJsModuleInfo *)moduleMemory),
              iVar10 < iVar11; import._0_4_ = (int)import + 1) {
            pMStack_e0 = AsmJsModuleInfo::GetVarImport((AsmJsModuleInfo *)moduleMemory,(int)import);
            AsmJsVarType::AsmJsVarType((AsmJsVarType *)((long)&value + 7),pMStack_e0->type);
            _val_1 = Js::JavascriptOperators::OP_GetProperty
                               (local_250,pMStack_e0->field,*(ScriptContext **)(this + 0x78));
            bVar8 = CheckAndResetImplicitCall
                              (this,prevDisableImplicitFlags_00,savedImplicitCallFlags);
            if (bVar8) {
              pSVar25 = *(ScriptContext **)(this + 0x78);
              pPVar17 = ScriptContext::GetPropertyName
                                  (*(ScriptContext **)(this + 0x78),pMStack_e0->field);
              pcVar18 = PropertyRecord::GetBuffer(pPVar17);
              AsmJSCompiler::OutputError
                        (pSVar25,L"Asm.js Runtime Error : Accessing var import %s has side effects",
                         pcVar18);
              pvVar19 = ProcessLinkFailedAsmJsModule(this);
              return pvVar19;
            }
            if (((DAT_01e9e23a & 1) != 0) && (bVar8 = TaggedNumber::Is(_val_1), !bVar8)) {
              bVar8 = VarIs<Js::RecyclableObject>(_val_1);
              if (bVar8) {
                this_02 = VarTo<Js::RecyclableObject>(_val_1);
                typeId = RecyclableObject::GetTypeId(this_02);
                bVar8 = DynamicType::Is(typeId);
                if (!bVar8) goto LAB_00de7548;
              }
              pSVar25 = *(ScriptContext **)(this + 0x78);
              pPVar17 = ScriptContext::GetPropertyName
                                  (*(ScriptContext **)(this + 0x78),pMStack_e0->field);
              pcVar18 = PropertyRecord::GetBuffer(pPVar17);
              AsmJSCompiler::OutputError
                        (pSVar25,L"Asm.js Runtime Error : Var import %s must be primitive",pcVar18);
              goto LAB_00de7fb3;
            }
LAB_00de7548:
            bVar8 = AsmJsVarType::isInt((AsmJsVarType *)((long)&value + 7));
            if (bVar8) {
              val_2._4_4_ = JavascriptMath::ToInt32(_val_1,*(ScriptContext **)(this + 0x78));
              *(int32 *)((long)&pWVar7[iVar12].ptr + (ulong)pMStack_e0->location * 4) = val_2._4_4_;
            }
            else {
              bVar8 = AsmJsVarType::isFloat((AsmJsVarType *)((long)&value + 7));
              if (bVar8) {
                dVar27 = JavascriptConversion::ToNumber(_val_1,*(ScriptContext **)(this + 0x78));
                val_2._0_4_ = (float)dVar27;
                *(float *)((long)&pWVar7[iVar9].ptr + (ulong)pMStack_e0->location * 4) = val_2._0_4_
                ;
              }
              else {
                bVar8 = AsmJsVarType::isDouble((AsmJsVarType *)((long)&value + 7));
                if (bVar8) {
                  pvStack_100 = (void *)JavascriptConversion::ToNumber
                                                  (_val_1,*(ScriptContext **)(this + 0x78));
                  pWVar7[(long)iVar1 + (ulong)pMStack_e0->location].ptr = pvStack_100;
                }
              }
            }
            bVar8 = CheckAndResetImplicitCall
                              (this,prevDisableImplicitFlags_00,savedImplicitCallFlags);
            if (bVar8) {
              pSVar25 = *(ScriptContext **)(this + 0x78);
              pPVar17 = ScriptContext::GetPropertyName
                                  (*(ScriptContext **)(this + 0x78),pMStack_e0->field);
              pcVar18 = PropertyRecord::GetBuffer(pPVar17);
              AsmJSCompiler::OutputError
                        (pSVar25,L"Asm.js Runtime Error : Accessing var import %s has side effects",
                         pcVar18);
              pvVar19 = ProcessLinkFailedAsmJsModule(this);
              return pvVar19;
            }
          }
          for (import_1._4_4_ = 0; iVar12 = import_1._4_4_,
              iVar9 = AsmJsModuleInfo::GetFunctionImportCount((AsmJsModuleInfo *)moduleMemory),
              iVar12 < iVar9; import_1._4_4_ = import_1._4_4_ + 1) {
            importFunc = AsmJsModuleInfo::GetFunctionImport
                                   ((AsmJsModuleInfo *)moduleMemory,import_1._4_4_);
            pDisplay = (FrameDisplay *)
                       Js::JavascriptOperators::OP_GetProperty
                                 (local_250,((ModuleFunctionImport *)importFunc)->field,
                                  *(ScriptContext **)(this + 0x78));
            bVar8 = CheckAndResetImplicitCall
                              (this,prevDisableImplicitFlags_00,savedImplicitCallFlags);
            if (bVar8) {
              pSVar25 = *(ScriptContext **)(this + 0x78);
              pPVar17 = ScriptContext::GetPropertyName
                                  (*(ScriptContext **)(this + 0x78),
                                   *(PropertyId *)((long)importFunc + 4));
              pcVar18 = PropertyRecord::GetBuffer(pPVar17);
              AsmJSCompiler::OutputError
                        (pSVar25,
                         L"Asm.js Runtime Error : Accessing foreign function import %s has side effects"
                         ,pcVar18);
              pvVar19 = ProcessLinkFailedAsmJsModule(this);
              return pvVar19;
            }
            bVar8 = VarIs<Js::JavascriptFunction>(pDisplay);
            if (!bVar8) {
              pSVar25 = *(ScriptContext **)(this + 0x78);
              pPVar17 = ScriptContext::GetPropertyName
                                  (*(ScriptContext **)(this + 0x78),
                                   *(PropertyId *)((long)importFunc + 4));
              pcVar18 = PropertyRecord::GetBuffer(pPVar17);
              AsmJSCompiler::OutputError
                        (pSVar25,
                         L"Asm.js Runtime Error : Foreign function import %s is not a function",
                         pcVar18);
              goto LAB_00de7fb3;
            }
            Memory::WriteBarrierPtr<void>::operator=
                      (pWVar7 + (long)iVar2 + (ulong)*importFunc,pDisplay);
          }
          ThreadContext::SetDisableImplicitFlags(this_01,prevDisableImplicitFlags_00);
          ThreadContext::SetImplicitCallFlags(this_01,savedImplicitCallFlags);
          pRVar14 = ScriptContext::GetRecycler(*(ScriptContext **)(this + 0x78));
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_148,(type_info *)&FrameDisplay::typeinfo,8,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                     ,0xae7);
          pRVar14 = Memory::Recycler::TrackAllocInfo(pRVar14,&local_148);
          pcStack_158 = Memory::Recycler::Alloc;
          local_150 = 0;
          this_03 = (FrameDisplay *)new<Memory::Recycler>(8,pRVar14,0x446fd0,0);
          FrameDisplay::FrameDisplay(this_03,0,false);
          local_120 = this_03;
          for (modFunc._4_4_ = 0; uVar6 = modFunc._4_4_,
              iVar12 = AsmJsModuleInfo::GetFunctionCount((AsmJsModuleInfo *)moduleMemory),
              (int)uVar6 < iVar12; modFunc._4_4_ = modFunc._4_4_ + 1) {
            functionInfo = (FunctionInfoPtrPtr)
                           AsmJsModuleInfo::GetFunction
                                     ((AsmJsModuleInfo *)moduleMemory,modFunc._4_4_);
            scriptFuncObj =
                 (AsmJsScriptFunction *)
                 ParseableFunctionInfo::GetNestedFuncReference
                           (*(ParseableFunctionInfo **)(this + 0x88),modFunc._4_4_);
            entrypointInfo =
                 (FunctionEntryPointInfo *)
                 AsmJsScriptFunction::OP_NewAsmJsFunc(local_120,(FunctionInfoPtrPtr)scriptFuncObj);
            Memory::WriteBarrierPtr<void>::operator=
                      (pWVar7 + (long)iVar3 + (ulong)*(uint *)&functionInfo->ptr,entrypointInfo);
            pDVar20 = DynamicObject::GetDynamicType((DynamicObject *)entrypointInfo);
            p_Var21 = Js::Type::GetEntryPoint(&pDVar20->super_Type);
            if (p_Var21 == JavascriptFunction::DeferredDeserializeThunk) {
              JavascriptFunction::DeferredDeserialize((ScriptFunction *)entrypointInfo);
            }
            pDVar20 = DynamicObject::GetDynamicType((DynamicObject *)entrypointInfo);
            DynamicType::SetEntryPoint(pDVar20,AsmJsExternalEntryPoint);
            pFVar22 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)entrypointInfo);
            this_04 = FunctionBody::GetAsmJsFunctionInfo(pFVar22);
            AsmJsFunctionInfo::SetModuleFunctionBody(this_04,(FunctionBody *)info);
            AsmJsScriptFunction::SetModuleEnvironment
                      ((AsmJsScriptFunction *)entrypointInfo,local_38);
            bVar8 = AsmJsModuleInfo::IsRuntimeProcessed((AsmJsModuleInfo *)moduleMemory);
            if (!bVar8) {
              pEStack_180 = (EntryPointInfo *)
                            ScriptFunction::GetEntryPointInfo((ScriptFunction *)entrypointInfo);
              EntryPointInfo::SetIsAsmJSFunction(pEStack_180,true);
              bVar8 = Phases::IsEnabled((Phases *)&DAT_01eb5b30,AsmJsJITTemplatePhase);
              if (!bVar8) {
                (pEStack_180->super_ProxyEntryPointInfo).jsMethod =
                     AsmJsDelayDynamicInterpreterThunk;
              }
            }
          }
          for (modFuncTable._4_4_ = 0; iVar12 = modFuncTable._4_4_,
              iVar9 = AsmJsModuleInfo::GetFunctionTableCount((AsmJsModuleInfo *)moduleMemory),
              iVar12 < iVar9; modFuncTable._4_4_ = modFuncTable._4_4_ + 1) {
            funcTableArray =
                 (Type *)AsmJsModuleInfo::GetFunctionTable
                                   ((AsmJsModuleInfo *)moduleMemory,modFuncTable._4_4_);
            pRVar14 = ScriptContext::GetRecycler(*(ScriptContext **)(this + 0x78));
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_1c0,(type_info *)&Memory::WriteBarrierPtr<void>::typeinfo,0,
                       (ulong)*(uint *)&funcTableArray->ptr,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                       ,0xb11);
            pRVar14 = Memory::Recycler::TrackAllocInfo(pRVar14,&local_1c0);
            local_198 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                                  ((Memory *)pRVar14,(Recycler *)Memory::Recycler::Alloc,0,
                                   (ulong)*(uint *)&funcTableArray->ptr);
            for (functionPtr._4_4_ = 0; functionPtr._4_4_ < *(uint *)&funcTableArray->ptr;
                functionPtr._4_4_ = functionPtr._4_4_ + 1) {
              ppuVar23 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                                   ((WriteBarrierPtr *)(funcTableArray + 1));
              ppvVar16 = Memory::WriteBarrierPtr::operator_cast_to_void__
                                   ((WriteBarrierPtr *)
                                    (pWVar7 + (long)iVar3 + (ulong)(*ppuVar23)[functionPtr._4_4_]));
              Memory::WriteBarrierPtr<void>::operator=(local_198 + functionPtr._4_4_,*ppvVar16);
            }
            Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator=
                      ((WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> *)
                       (pWVar7 + (long)iVar4 + (long)modFuncTable._4_4_),local_198);
          }
          bVar8 = Phases::IsEnabled((Phases *)&DAT_01eb5b30,AsmJsJITTemplatePhase);
          if (((bVar8) && (DAT_01eafd60 == 0)) ||
             ((bVar8 = Phases::IsEnabled((Phases *)&DAT_01eb5b30,AsmJsJITTemplatePhase), !bVar8 &&
              ((DAT_01eafd68 == 0 || ((DAT_01ea9f0a & 1) != 0)))))) {
            bVar8 = Phases::IsEnabled((Phases *)&DAT_01ec1678,AsmjsEntryPointInfoPhase);
            if (bVar8) {
              uVar24 = (*(code *)(info->mRecycler->pinnedObjectMap).allocator)();
              Output::Print(L"%s Scheduling For Full JIT at callcount:%d\n",uVar24,0);
              Output::Flush();
            }
            for (functionObj._4_4_ = 0;
                iVar12 = AsmJsModuleInfo::GetFunctionCount((AsmJsModuleInfo *)moduleMemory),
                functionObj._4_4_ < iVar12; functionObj._4_4_ = functionObj._4_4_ + 1) {
              ppvVar16 = Memory::PointerValue<void>(pWVar7 + (long)iVar3 + (long)functionObj._4_4_);
              func_00 = (ScriptFunction *)*ppvVar16;
              if (func_00 == (ScriptFunction *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar15 = 1;
                bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                            ,0xb2b,"(functionObj != nullptr)",
                                            "functionObj != nullptr");
                if (!bVar8) {
                  pcVar5 = (code *)invalidInstructionException();
                  (*pcVar5)();
                }
                puVar15 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar15 = 0;
              }
              p_Var21 = RecyclableObject::GetEntryPoint((RecyclableObject *)func_00);
              if (p_Var21 == AsmJsExternalEntryPoint) {
                WAsmJs::JitFunctionIfReady(func_00,0);
              }
            }
          }
          AsmJsModuleInfo::SetIsRuntimeProcessed((AsmJsModuleInfo *)moduleMemory,true);
          iVar12 = AsmJsModuleInfo::GetExportsCount((AsmJsModuleInfo *)moduleMemory);
          if (iVar12 == 0) {
            RVar13 = AsmJsModuleInfo::GetExportFunctionIndex((AsmJsModuleInfo *)moduleMemory);
            ppvVar16 = Memory::WriteBarrierPtr::operator_cast_to_void__
                                 ((WriteBarrierPtr *)(pWVar7 + (long)iVar3 + (ulong)RVar13));
            pIVar26 = (InterpreterStackFrame *)*ppvVar16;
            SetReg<unsigned_int>(this,0,pIVar26);
            this_local = pIVar26;
          }
          else {
            pSVar25 = GetScriptContext(this);
            propIds = AsmJsModuleInfo::GetExportsIdArray((AsmJsModuleInfo *)moduleMemory);
            pFVar22 = GetFunctionBody(this);
            literalType = FunctionBody::GetObjectLiteralTypeRef(pFVar22,0);
            pIVar26 = (InterpreterStackFrame *)
                      Js::JavascriptOperators::NewScObjectLiteral(pSVar25,propIds,literalType);
            for (ex.location._4_4_ = 0;
                iVar12 = AsmJsModuleInfo::GetExportsCount((AsmJsModuleInfo *)moduleMemory),
                ex.location._4_4_ < iVar12; ex.location._4_4_ = ex.location._4_4_ + 1) {
              MVar28 = AsmJsModuleInfo::GetExport((AsmJsModuleInfo *)moduleMemory,ex.location._4_4_)
              ;
              ex.id = (PropertyId *)MVar28.location;
              ppvVar16 = Memory::WriteBarrierPtr::operator_cast_to_void__
                                   ((WriteBarrierPtr *)(pWVar7 + (long)iVar3 + (ulong)(uint)*ex.id))
              ;
              func = MVar28.id;
              Js::JavascriptOperators::OP_InitProperty(pIVar26,*func,*ppvVar16);
            }
            SetReg<unsigned_int>(this,0,pIVar26);
            this_local = pIVar26;
          }
        }
      }
      else {
LAB_00de7fb3:
        ThreadContext::SetDisableImplicitFlags(this_01,prevDisableImplicitFlags_00);
        ThreadContext::SetImplicitCallFlags(this_01,savedImplicitCallFlags);
        this_local = (InterpreterStackFrame *)ProcessLinkFailedAsmJsModule(this);
      }
    }
    else {
      AsmJSCompiler::OutputError
                (*(ScriptContext **)(this + 0x78),
                 L"Asm.js Runtime Error : Invalid module argument count");
      this_local = (InterpreterStackFrame *)ProcessLinkFailedAsmJsModule(this);
    }
  }
  else {
    AsmJSCompiler::OutputError
              (*(ScriptContext **)(this + 0x78),L"Asm.js Runtime Error : Forcing link failure");
    this_local = (InterpreterStackFrame *)ProcessLinkFailedAsmJsModule(this);
  }
  return this_local;
}

Assistant:

Var InterpreterStackFrame::ProcessAsmJsModule()
    {
        FunctionBody* asmJsModuleFunctionBody = GetFunctionBody();
        AsmJsModuleInfo* info = asmJsModuleFunctionBody->GetAsmJsModuleInfo();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (Configuration::Global.flags.ForceAsmJsLinkFail)
        {
            AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Forcing link failure"));
            return this->ProcessLinkFailedAsmJsModule();
        }
#endif
        if (m_inSlotsCount != info->GetArgInCount() + 1)
        {
            // Error reparse without asm.js
            AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Invalid module argument count"));
            return this->ProcessLinkFailedAsmJsModule();
        }

        const AsmJsModuleMemory& moduleMemory = info->GetModuleMemory();
        Field(Var)* moduleMemoryPtr = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), moduleMemory.mMemorySize);
        Field(Var)* arrayBufferPtr = moduleMemoryPtr + moduleMemory.mArrayBufferOffset;
        Assert(moduleMemory.mArrayBufferOffset == AsmJsModuleMemory::MemoryTableBeginOffset);
        Field(Var)* stdLibPtr = moduleMemoryPtr + moduleMemory.mStdLibOffset;
        int* localIntSlots = (int*)(moduleMemoryPtr + moduleMemory.mIntOffset);
        float* localFloatSlots = (float*)(moduleMemoryPtr + moduleMemory.mFloatOffset);
        double* localDoubleSlots = (double*)(moduleMemoryPtr + moduleMemory.mDoubleOffset);
        Field(Var)* localFunctionImports = moduleMemoryPtr + moduleMemory.mFFIOffset;
        Field(Var)* localModuleFunctions = moduleMemoryPtr + moduleMemory.mFuncOffset;
        Field(Field(Var)*)* localFunctionTables = (Field(Field(Var)*)*)(moduleMemoryPtr + moduleMemory.mFuncPtrOffset);

        ThreadContext* threadContext = this->scriptContext->GetThreadContext();
        *stdLibPtr = (m_inSlotsCount > 1) ? m_inParams[1] : nullptr;

        Var foreign = (m_inSlotsCount > 2) ? m_inParams[2] : nullptr;
        *arrayBufferPtr = (m_inSlotsCount > 3) ? m_inParams[3] : nullptr;
        //cache the current state of the disable implicit call flag
        DisableImplicitFlags prevDisableImplicitFlags = threadContext->GetDisableImplicitFlags();
        ImplicitCallFlags saveImplicitcallFlags = threadContext->GetImplicitCallFlags();
        // Disable implicit calls to check if any of the VarImport or Function Import leads to implicit calls
        threadContext->DisableImplicitCall();
        threadContext->SetImplicitCallFlags(ImplicitCallFlags::ImplicitCall_None);
        bool checkParamResult = ASMLink::CheckParams(this->scriptContext, info, *stdLibPtr, foreign, *arrayBufferPtr);
        if (!checkParamResult)
        {
            // don't need to print, because checkParams will do it for us
            goto linkFailure;
        }
        else if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
        {
            AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Params have side effects"));
            return this->ProcessLinkFailedAsmJsModule();
        }
        // Initialize Variables
        for (int i = 0; i < info->GetVarCount(); i++)
        {
            const auto& var = info->GetVar(i);
            const AsmJsVarType type(var.type);
            if (type.isInt())
            {
                localIntSlots[var.location] = var.initialiser.intInit;
            }
            else if (type.isFloat())
            {
                localFloatSlots[var.location] = var.initialiser.floatInit;
            }
            else if (type.isDouble())
            {
                localDoubleSlots[var.location] = var.initialiser.doubleInit;
            }
            else
            {
                Assert(UNREACHED);
            }
        }

        // Load constant variables
        for (int i = 0; i < info->GetVarImportCount(); i++)
        {
            const auto& import = info->GetVarImport(i);
            const AsmJsVarType type(import.type);
            // this might throw, but it would anyway in non-asm.js
            Var value = JavascriptOperators::OP_GetProperty(foreign, import.field, scriptContext);
            // check if there is implicit call and if there is implicit call then clear the disableimplicitcall flag
            if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
            {
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Accessing var import %s has side effects"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                return this->ProcessLinkFailedAsmJsModule();
            }
            if (CONFIG_FLAG(AsmJsEdge))
            {
                // emscripten had a bug which caused this check to fail in some circumstances, so this check fails for some demos
                if (!TaggedNumber::Is(value) && (!VarIs<RecyclableObject>(value) || DynamicType::Is(VarTo<RecyclableObject>(value)->GetTypeId())))
                {
                    AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Var import %s must be primitive"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                    goto linkFailure;
                }
            }

            if (type.isInt())
            {
                int val = JavascriptMath::ToInt32(value, scriptContext);
                localIntSlots[import.location] = val;
            }
            else if (type.isFloat())
            {
                float val = (float)JavascriptConversion::ToNumber(value, scriptContext);
                localFloatSlots[import.location] = val;
            }
            else if (type.isDouble())
            {
                double val = JavascriptConversion::ToNumber(value, scriptContext);
                localDoubleSlots[import.location] = val;
            }

            // check for implicit call after converting to number
            if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
            {
                // Runtime error
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Accessing var import %s has side effects"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                return this->ProcessLinkFailedAsmJsModule();
            }
        }
        // Load external functions
        for (int i = 0; i < info->GetFunctionImportCount(); i++)
        {
            const auto& import = info->GetFunctionImport(i);
            // this might throw, but it would anyway in non-asm.js
            Var importFunc = JavascriptOperators::OP_GetProperty(foreign, import.field, scriptContext);
            // check if there is implicit call and if there is implicit call then clear the disableimplicitcall flag
            if (this->CheckAndResetImplicitCall(prevDisableImplicitFlags, saveImplicitcallFlags))
            {
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Accessing foreign function import %s has side effects"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                return this->ProcessLinkFailedAsmJsModule();
            }
            if (!VarIs<JavascriptFunction>(importFunc))
            {
                AsmJSCompiler::OutputError(this->scriptContext, _u("Asm.js Runtime Error : Foreign function import %s is not a function"), this->scriptContext->GetPropertyName(import.field)->GetBuffer());
                goto linkFailure;
            }
            localFunctionImports[import.location] = importFunc;
        }

        threadContext->SetDisableImplicitFlags(prevDisableImplicitFlags);
        threadContext->SetImplicitCallFlags(saveImplicitcallFlags);
        // scope
        {
            FrameDisplay* pDisplay = RecyclerNewPlus(scriptContext->GetRecycler(), sizeof(void*), FrameDisplay, 0);
            //DynamicObject* asmModule = scriptContext->GetLibrary()->CreateObject(false, 1);
            //JavascriptOperators::OP_SetProperty(asmModule, PropertyIds::module, moduleMemoryPtr, scriptContext);
            //pDisplay->SetItem(0, this->function);
            for (int i = 0; i < info->GetFunctionCount(); i++)
            {
                const auto& modFunc = info->GetFunction(i);

                // TODO: add more runtime checks here
                FunctionInfoPtrPtr functionInfo = m_functionBody->GetNestedFuncReference(i);

                AsmJsScriptFunction* scriptFuncObj = AsmJsScriptFunction::OP_NewAsmJsFunc(pDisplay, functionInfo);
                localModuleFunctions[modFunc.location] = scriptFuncObj;

                if (scriptFuncObj->GetDynamicType()->GetEntryPoint() == DefaultDeferredDeserializeThunk)
                {
                    JavascriptFunction::DeferredDeserialize(scriptFuncObj);
                }

                scriptFuncObj->GetDynamicType()->SetEntryPoint(AsmJsExternalEntryPoint);
                scriptFuncObj->GetFunctionBody()->GetAsmJsFunctionInfo()->SetModuleFunctionBody(asmJsModuleFunctionBody);
                scriptFuncObj->SetModuleEnvironment(moduleMemoryPtr);
                if (!info->IsRuntimeProcessed())
                {
                    // don't reset entrypoint upon relinking
                    FunctionEntryPointInfo* entrypointInfo = (FunctionEntryPointInfo*)scriptFuncObj->GetEntryPointInfo();
                    entrypointInfo->SetIsAsmJSFunction(true);

#if DYNAMIC_INTERPRETER_THUNK
                    if (!PHASE_ON1(AsmJsJITTemplatePhase))
                    {
                        entrypointInfo->jsMethod = AsmJsDefaultEntryThunk;
                    }
#endif
                }
            }
        }

        // Initialize function table arrays
        for (int i = 0; i < info->GetFunctionTableCount(); i++)
        {
            const auto& modFuncTable = info->GetFunctionTable(i);
            Field(Var)* funcTableArray = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), modFuncTable.size);
            for (uint j = 0; j < modFuncTable.size; j++)
            {
                // get the module function index
                const RegSlot index = modFuncTable.moduleFunctionIndex[j];
                // assign the module function pointer to the array
                Var functionPtr = localModuleFunctions[index];
                funcTableArray[j] = functionPtr;
            }
            localFunctionTables[i] = funcTableArray;
        }
        // Do MTJRC/MAIC:0 check
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (
            (PHASE_ON1(Js::AsmJsJITTemplatePhase) && CONFIG_FLAG(MaxTemplatizedJitRunCount) == 0) ||
            (!PHASE_ON1(Js::AsmJsJITTemplatePhase) && (CONFIG_FLAG(MaxAsmJsInterpreterRunCount) == 0 || CONFIG_FLAG(ForceNative)))
            )
        {
            if (PHASE_TRACE1(AsmjsEntryPointInfoPhase))
            {
                Output::Print(_u("%s Scheduling For Full JIT at callcount:%d\n"), asmJsModuleFunctionBody->GetDisplayName(), 0);
                Output::Flush();
            }
            for (int i = 0; i < info->GetFunctionCount(); i++)
            {
                ScriptFunction* functionObj = (ScriptFunction*)PointerValue(localModuleFunctions[i]);
                AnalysisAssert(functionObj != nullptr);
                // don't want to generate code for APIs like changeHeap
                if (functionObj->GetEntryPoint() == Js::AsmJsExternalEntryPoint)
                {
                    WAsmJs::JitFunctionIfReady(functionObj);
                }
            }
        }
#endif

        info->SetIsRuntimeProcessed(true);

        // create export object
        if (info->GetExportsCount())
        {
            Var newObj = JavascriptOperators::NewScObjectLiteral(GetScriptContext(), info->GetExportsIdArray(),
                this->GetFunctionBody()->GetObjectLiteralTypeRef(0));
            for (int i = 0; i < info->GetExportsCount(); i++)
            {
                auto ex = info->GetExport(i);
                Var func = localModuleFunctions[*ex.location];
                JavascriptOperators::OP_InitProperty(newObj, *ex.id, func);
            }
            SetReg((RegSlot)0, newObj);
            return newObj;
        }


        // export only 1 function
        {
            Var exportFunc = localModuleFunctions[info->GetExportFunctionIndex()];
            SetReg((RegSlot)0, exportFunc);
            return exportFunc;
        }

    linkFailure:
        threadContext->SetDisableImplicitFlags(prevDisableImplicitFlags);
        threadContext->SetImplicitCallFlags(saveImplicitcallFlags);
        return this->ProcessLinkFailedAsmJsModule();
    }